

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O2

TPZVec<TPZGeoElSidePartition> * __thiscall
TPZVec<TPZGeoElSidePartition>::operator=
          (TPZVec<TPZGeoElSidePartition> *this,TPZVec<TPZGeoElSidePartition> *copy)

{
  int64_t i;
  long lVar1;
  long lVar2;
  
  if (this != copy) {
    (*this->_vptr_TPZVec[3])(this,copy->fNElements);
    lVar2 = 0;
    for (lVar1 = 0; lVar1 < copy->fNElements; lVar1 = lVar1 + 1) {
      TPZGeoElSidePartition::operator=
                ((TPZGeoElSidePartition *)
                 ((long)&(this->fStore->fCurrent).super_TPZSavable._vptr_TPZSavable + lVar2),
                 (TPZGeoElSidePartition *)
                 ((long)&(copy->fStore->fCurrent).super_TPZSavable._vptr_TPZSavable + lVar2));
      lVar2 = lVar2 + 0x38;
    }
  }
  return this;
}

Assistant:

TPZVec<T> &TPZVec<T>::operator=(const TPZVec<T> &copy){
    if (this != &copy) {

      Resize(copy.NElements());

      for (int64_t i = 0; i < copy.fNElements; i++)
          fStore[i] = copy.fStore[i];
    }
    return *this;
}